

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

void isobusfs_cmn_dump_last_x_bytes(uint8_t *buffer,size_t buffer_size,size_t x)

{
  uint uVar1;
  ushort **ppuVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  char output [80];
  int local_bc;
  int local_b8;
  long local_a8;
  uint8_t *local_98;
  char local_88 [88];
  
  uVar3 = 0;
  if (x < buffer_size) {
    uVar3 = buffer_size - x & 0xfffffffffffffff8;
  }
  if (x == 0) {
    uVar3 = 0;
  }
  if (uVar3 < buffer_size) {
    local_bc = ~(uint)uVar3 + (int)buffer_size;
    local_98 = buffer + uVar3;
    local_a8 = uVar3 + 1;
    uVar7 = uVar3;
    while (uVar1 = snprintf(local_88,0x50,"%08lx: ",uVar3 + uVar7), uVar1 < 0x50) {
      pcVar8 = local_88 + uVar1;
      lVar5 = 8;
      uVar10 = uVar7;
      iVar9 = 0x50 - uVar1;
      do {
        if (((buffer_size <= uVar10) ||
            (uVar1 = snprintf(pcVar8,(long)iVar9,"%02x ",(ulong)buffer[uVar10]), (int)uVar1 < 0)) ||
           (iVar6 = iVar9 - uVar1, iVar6 == 0 || iVar9 < (int)uVar1)) break;
        pcVar8 = pcVar8 + uVar1;
        uVar10 = uVar10 + 1;
        lVar5 = lVar5 + -1;
        iVar9 = iVar6;
      } while (lVar5 != 0);
      local_b8 = (int)uVar7;
      iVar6 = local_bc;
      if ((int)buffer_size - local_b8 < 8) {
        do {
          uVar1 = snprintf(pcVar8,(long)iVar9,"   ");
          if (((int)uVar1 < 0) || (iVar4 = iVar9 - uVar1, iVar4 == 0 || iVar9 < (int)uVar1)) break;
          pcVar8 = pcVar8 + uVar1;
          iVar6 = iVar6 + 1;
          iVar9 = iVar4;
        } while (iVar6 < 7);
      }
      uVar1 = snprintf(pcVar8,(long)iVar9,"  ");
      if ((int)uVar1 < 0) {
        return;
      }
      iVar6 = iVar9 - uVar1;
      if (iVar6 == 0 || iVar9 < (int)uVar1) {
        return;
      }
      if (uVar7 < buffer_size) {
        pcVar8 = pcVar8 + uVar1;
        ppuVar2 = __ctype_b_loc();
        lVar5 = 0;
        do {
          uVar10 = 0x2e;
          if (((*ppuVar2)[local_98[lVar5]] >> 0xe & 1) != 0) {
            uVar10 = (ulong)local_98[lVar5];
          }
          uVar1 = snprintf(pcVar8,(long)iVar6,"%c",uVar10);
          if ((((int)uVar1 < 0) || (iVar9 = iVar6 - uVar1, iVar9 == 0 || iVar6 < (int)uVar1)) ||
             (iVar6 = iVar9, lVar5 == 7)) break;
          pcVar8 = pcVar8 + uVar1;
          uVar10 = local_a8 + lVar5;
          lVar5 = lVar5 + 1;
        } while (uVar10 < buffer_size);
      }
      isobusfs_log(LOG_LEVEL_DEBUG,"%s",local_88);
      if ((int)uVar1 < 0) {
        return;
      }
      if (iVar6 <= (int)uVar1) {
        return;
      }
      uVar7 = uVar7 + 8;
      local_bc = local_bc + -8;
      local_98 = local_98 + 8;
      local_a8 = local_a8 + 8;
      if (buffer_size <= uVar7) {
        return;
      }
    }
  }
  return;
}

Assistant:

void isobusfs_cmn_dump_last_x_bytes(const uint8_t *buffer, size_t buffer_size,
				    size_t x)
{
	size_t start_offset = 0;
	char *output_ptr;
	unsigned char c;
	int remaining;
	char output[80];
	int n, j;

	if (x > 0 && x < buffer_size)
		start_offset = (buffer_size - x) & ~0x7;

	for (size_t i = start_offset; i < buffer_size; i += 8) {
		output_ptr = output;
		remaining = (int)sizeof(output);

		n = snprintf(output_ptr, remaining, "%08lx: ",
			     (unsigned long)(start_offset + i));
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			n = snprintf(output_ptr, remaining, "%02x ", buffer[i+j]);
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		for (j = buffer_size - i; j < 8; ++j) {
			n = snprintf(output_ptr, remaining, "   ");
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		n = snprintf(output_ptr, remaining, "  ");
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			c = buffer[i+j];
			n = snprintf(output_ptr, remaining, "%c",
				     isprint(c) ? c : '.');
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		pr_debug("%s", output);
		if (n < 0 || n >= remaining)
			break;
	}
}